

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-socket.c
# Opt level: O2

CURLcode cf_udp_connect(Curl_cfilter *cf,Curl_easy *data,_Bool blocking,_Bool *done)

{
  int *piVar1;
  int *piVar2;
  CURLcode CVar3;
  int iVar4;
  undefined8 in_RAX;
  int *piVar5;
  char *pcVar6;
  int __optname;
  int __level;
  int local_38;
  int val;
  
  piVar5 = &stack0xffffffffffffffc8;
  if ((cf->field_0x24 & 1) != 0) {
    *done = true;
    return CURLE_OK;
  }
  piVar1 = (int *)cf->ctx;
  *done = false;
  if (piVar1[0x26] != -1) {
    return CURLE_COULDNT_CONNECT;
  }
  _local_38 = in_RAX;
  CVar3 = cf_socket_open(cf,data);
  if (CVar3 != CURLE_OK) {
    if (data == (Curl_easy *)0x0) {
      return CVar3;
    }
    if (((data->set).field_0x8bd & 0x10) != 0) {
      if (0 < cf->cft->log_level) {
        Curl_trc_cf_infof(data,cf,"cf_udp_connect(), open failed -> %d",(ulong)CVar3);
        return CVar3;
      }
      return CVar3;
    }
    return CVar3;
  }
  if (*piVar1 != 5) {
    if (((data != (Curl_easy *)0x0) && (((data->set).field_0x8bd & 0x10) != 0)) &&
       (0 < cf->cft->log_level)) {
      Curl_trc_cf_infof(data,cf,"cf_udp_connect(), opened socket=%d (unconnected)",
                        (ulong)(uint)piVar1[0x26]);
    }
    goto LAB_00586a18;
  }
  piVar2 = (int *)cf->ctx;
  iVar4 = connect(piVar2[0x26],(sockaddr *)(piVar2 + 6),piVar2[5]);
  if (iVar4 == -1) {
    piVar5 = __errno_location();
    CVar3 = socket_connect_result(data,(char *)(piVar2 + 0x38),*piVar5);
    if (CVar3 != CURLE_OK) {
      return CVar3;
    }
  }
  else {
    *(byte *)(piVar2 + 0x5f) = *(byte *)(piVar2 + 0x5f) | 4;
    set_local_ip(cf,data);
    if (((data != (Curl_easy *)0x0) && (((data->set).field_0x8bd & 0x10) != 0)) &&
       (0 < cf->cft->log_level)) {
      pcVar6 = "UDP";
      if (*piVar2 == 5) {
        pcVar6 = "QUIC";
      }
      Curl_trc_cf_infof(data,cf,"%s socket %d connected: [%s:%d] -> [%s:%d]",pcVar6,
                        (ulong)(uint)piVar2[0x26],piVar2 + 0x45,(ulong)(uint)piVar2[0x51],
                        piVar2 + 0x38,(ulong)(uint)piVar2[0x44]);
    }
    curlx_nonblock(piVar2[0x26],1);
    if (piVar2[2] == 10) {
      _local_38 = CONCAT44(val,2);
      iVar4 = piVar2[0x26];
      __level = 0x29;
      __optname = 0x17;
    }
    else {
      if (piVar2[2] != 2) goto LAB_005869d7;
      piVar5 = &val;
      _local_38 = CONCAT44(2,local_38);
      iVar4 = piVar2[0x26];
      __optname = 10;
      __level = 0;
    }
    setsockopt(iVar4,__level,__optname,piVar5,4);
  }
LAB_005869d7:
  if (((data != (Curl_easy *)0x0) && (((data->set).field_0x8bd & 0x10) != 0)) &&
     (0 < cf->cft->log_level)) {
    Curl_trc_cf_infof(data,cf,"cf_udp_connect(), opened socket=%d (%s:%d)",(ulong)(uint)piVar1[0x26]
                      ,piVar1 + 0x45,(ulong)(uint)piVar1[0x51]);
  }
LAB_00586a18:
  *done = true;
  cf->field_0x24 = cf->field_0x24 | 1;
  return CURLE_OK;
}

Assistant:

static CURLcode cf_udp_connect(struct Curl_cfilter *cf,
                               struct Curl_easy *data,
                               bool blocking, bool *done)
{
  struct cf_socket_ctx *ctx = cf->ctx;
  CURLcode result = CURLE_COULDNT_CONNECT;

  (void)blocking;
  if(cf->connected) {
    *done = TRUE;
    return CURLE_OK;
  }
  *done = FALSE;
  if(ctx->sock == CURL_SOCKET_BAD) {
    result = cf_socket_open(cf, data);
    if(result) {
      CURL_TRC_CF(data, cf, "cf_udp_connect(), open failed -> %d", result);
      goto out;
    }

    if(ctx->transport == TRNSPRT_QUIC) {
      result = cf_udp_setup_quic(cf, data);
      if(result)
        goto out;
      CURL_TRC_CF(data, cf, "cf_udp_connect(), opened socket=%"
                  CURL_FORMAT_SOCKET_T " (%s:%d)",
                  ctx->sock, ctx->l_ip, ctx->l_port);
    }
    else {
      CURL_TRC_CF(data, cf, "cf_udp_connect(), opened socket=%"
                  CURL_FORMAT_SOCKET_T " (unconnected)", ctx->sock);
    }
    *done = TRUE;
    cf->connected = TRUE;
  }
out:
  return result;
}